

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_init_gfx(int screen_width,int screen_height,rf_gfx_backend_data *gfx_data)

{
  undefined8 *puVar1;
  int iVar2;
  rf_glyph_info *prVar3;
  rf_mipmaps_image image;
  anon_struct_76160_27_a7251cd6_for_rf_context_0 *paVar4;
  rf_context *prVar5;
  _Bool _Var6;
  uint uVar7;
  uchar *__s;
  size_t sVar8;
  ulong uVar9;
  rf_default_font **__src;
  long lVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  bool bVar14;
  int num_ext;
  uchar pixels [4];
  rf_color font_pixels [16384];
  int iStack_10144;
  char *pcStack_10140;
  char *pcStack_10138;
  undefined8 uStack_10130;
  char *pcStack_10128;
  undefined4 in_stack_fffffffffffefee0;
  undefined4 in_stack_fffffffffffefee4;
  undefined8 in_stack_fffffffffffefee8;
  undefined4 in_stack_fffffffffffefef0;
  undefined4 in_stack_fffffffffffefef4;
  undefined4 in_stack_fffffffffffefef8;
  undefined4 in_stack_fffffffffffefefc;
  rf_default_font *prStack_10038;
  char *pcStack_10030;
  undefined8 uStack_10028;
  undefined4 uStack_10020;
  
  prVar5 = rf__ctx;
  (rf__ctx->field_0).current_matrix_mode = 0xffffffff;
  (prVar5->field_0).screen_scaling.m0 = 1.0;
  (prVar5->field_0).screen_scaling.m4 = 0.0;
  (prVar5->field_0).screen_scaling.m8 = 0.0;
  (prVar5->field_0).screen_scaling.m12 = 0.0;
  (prVar5->field_0).screen_scaling.m1 = 0.0;
  (prVar5->field_0).screen_scaling.m5 = 1.0;
  (prVar5->field_0).screen_scaling.m9 = 0.0;
  (prVar5->field_0).screen_scaling.m13 = 0.0;
  (prVar5->field_0).screen_scaling.m2 = 0.0;
  (prVar5->field_0).screen_scaling.m6 = 0.0;
  (prVar5->field_0).screen_scaling.m10 = 1.0;
  (prVar5->field_0).screen_scaling.m14 = 0.0;
  (prVar5->field_0).screen_scaling.m3 = 0.0;
  (prVar5->field_0).screen_scaling.m7 = 0.0;
  (prVar5->field_0).screen_scaling.m11 = 0.0;
  (prVar5->field_0).screen_scaling.m15 = 1.0;
  (prVar5->field_0).framebuffer_width = screen_width;
  (prVar5->field_0).framebuffer_height = screen_height;
  (prVar5->field_0).render_width = screen_width;
  (prVar5->field_0).render_height = screen_height;
  (prVar5->field_0).current_width = screen_width;
  (prVar5->field_0).current_height = screen_height;
  memcpy(&(prVar5->field_0).gfx_ctx,gfx_data,0x2b8);
  (prVar5->field_0).gfx_ctx.extensions.max_depth_bits = 0x10;
  iStack_10144 = 0;
  (prVar5->field_0).gfx_ctx.extensions.tex_npot_supported = true;
  (prVar5->field_0).gfx_ctx.extensions.tex_float_supported = true;
  (prVar5->field_0).gfx_ctx.extensions.tex_depth_supported = true;
  (*(prVar5->field_0).gfx_ctx.gl.GetIntegerv)(0x821d,&iStack_10144);
  if (0 < iStack_10144) {
    lVar13 = 0;
    do {
      __s = (*(rf__ctx->field_0).gfx_ctx.gl.GetStringi)(0x1f03,(uint)lVar13);
      sVar8 = strlen((char *)__s);
      iVar11 = (int)sVar8;
      _Var6 = rf_match_str_cstr((char *)__s,iVar11,"GL_EXT_texture_compression_s3tc");
      if (((_Var6) ||
          (_Var6 = rf_match_str_cstr((char *)__s,iVar11,"GL_WEBGL_compressed_texture_s3tc"), _Var6))
         || (_Var6 = rf_match_str_cstr((char *)__s,iVar11,"GL_WEBKIT_WEBGL_compressed_texture_s3tc")
            , _Var6)) {
        (rf__ctx->field_0).gfx_ctx.extensions.tex_comp_dxt_supported = true;
      }
      _Var6 = rf_match_str_cstr((char *)__s,iVar11,"GL_OES_compressed_ETC1_RGB8_texture");
      if ((_Var6) ||
         (_Var6 = rf_match_str_cstr((char *)__s,iVar11,"GL_WEBGL_compressed_texture_etc1"), _Var6))
      {
        (rf__ctx->field_0).gfx_ctx.extensions.tex_comp_etc1_supported = true;
      }
      _Var6 = rf_match_str_cstr((char *)__s,iVar11,"GL_ARB_ES3_compatibility");
      if (_Var6) {
        (rf__ctx->field_0).gfx_ctx.extensions.tex_comp_etc2_supported = true;
      }
      _Var6 = rf_match_str_cstr((char *)__s,iVar11,"GL_IMG_texture_compression_pvrtc");
      if (_Var6) {
        (rf__ctx->field_0).gfx_ctx.extensions.tex_comp_pvrt_supported = true;
      }
      _Var6 = rf_match_str_cstr((char *)__s,iVar11,"GL_KHR_texture_compression_astc_hdr");
      if (_Var6) {
        (rf__ctx->field_0).gfx_ctx.extensions.tex_comp_astc_supported = true;
      }
      _Var6 = rf_match_str_cstr((char *)__s,iVar11,"GL_EXT_texture_filter_anisotropic");
      prVar5 = rf__ctx;
      if (_Var6) {
        (rf__ctx->field_0).gfx_ctx.extensions.tex_anisotropic_filter_supported = true;
        (*(prVar5->field_0).gfx_ctx.gl.GetFloatv)
                  (0x84ff,&(prVar5->field_0).gfx_ctx.extensions.max_anisotropic_level);
      }
      _Var6 = rf_match_str_cstr((char *)__s,iVar11,"GL_EXT_texture_mirror_clamp");
      if (_Var6) {
        (rf__ctx->field_0).gfx_ctx.extensions.tex_mirror_clamp_supported = true;
      }
      _Var6 = rf_match_str_cstr((char *)__s,iVar11,"GL_EXT_debug_marker");
      if (_Var6) {
        (rf__ctx->field_0).gfx_ctx.extensions.debug_marker_supported = true;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < iStack_10144);
  }
  prStack_10038 = (rf_default_font *)0x17c440;
  pcStack_10030 = "rf_gfx_backend_internal_init";
  uStack_10028 = 0x996f;
  rf_log_impl(2,0x17f879);
  if ((rf__ctx->field_0).gfx_ctx.extensions.tex_comp_dxt_supported != false) {
    pcStack_10140 =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_10138 = "rf_gfx_backend_internal_init";
    uStack_10130 = 0x9973;
    rf_log_impl(2,0x17f89d);
  }
  if ((rf__ctx->field_0).gfx_ctx.extensions.tex_comp_etc1_supported == true) {
    rf_log_impl(2,0x17f8ce);
  }
  if ((rf__ctx->field_0).gfx_ctx.extensions.tex_comp_etc2_supported == true) {
    rf_log_impl(2,0x17f900);
  }
  if ((rf__ctx->field_0).gfx_ctx.extensions.tex_comp_pvrt_supported == true) {
    rf_log_impl(2,0x17f936);
  }
  if ((rf__ctx->field_0).gfx_ctx.extensions.tex_comp_astc_supported == true) {
    rf_log_impl(2,0x17f968);
  }
  if ((rf__ctx->field_0).gfx_ctx.extensions.tex_anisotropic_filter_supported == true) {
    in_stack_fffffffffffefef0 = 0x17c440;
    in_stack_fffffffffffefef4 = 0;
    in_stack_fffffffffffefef8 = 0x17f85c;
    in_stack_fffffffffffefefc = 0;
    rf_log_impl(2,0x17f99a,
                SUB84((double)(rf__ctx->field_0).gfx_ctx.extensions.max_anisotropic_level,0));
  }
  if ((rf__ctx->field_0).gfx_ctx.extensions.tex_mirror_clamp_supported == true) {
    rf_log_impl(2,0x17f9df);
  }
  if ((rf__ctx->field_0).gfx_ctx.extensions.debug_marker_supported == true) {
    rf_log_impl(2,0x17fa17);
  }
  (*(rf__ctx->field_0).gfx_ctx.gl.DepthFunc)(0x203);
  (*(rf__ctx->field_0).gfx_ctx.gl.Disable)(0xb71);
  (*(rf__ctx->field_0).gfx_ctx.gl.BlendFunc)(0x302,0x303);
  (*(rf__ctx->field_0).gfx_ctx.gl.Enable)(0xbe2);
  (*(rf__ctx->field_0).gfx_ctx.gl.CullFace)(0x405);
  (*(rf__ctx->field_0).gfx_ctx.gl.FrontFace)(0x901);
  (*(rf__ctx->field_0).gfx_ctx.gl.Enable)(0xb44);
  (*(rf__ctx->field_0).gfx_ctx.gl.ClearColor)(0.0,0.0,0.0,1.0);
  (*(rf__ctx->field_0).gfx_ctx.gl.ClearDepth)(1.0);
  (*(rf__ctx->field_0).gfx_ctx.gl.Clear)(0x4100);
  pcStack_10140 = (char *)CONCAT44(pcStack_10140._4_4_,0xffffffff);
  uVar7 = rf_gfx_load_texture(&pcStack_10140,1,1,RF_UNCOMPRESSED_R8G8B8A8,1);
  (rf__ctx->field_0).default_texture_id = uVar7;
  if (uVar7 == 0) {
    rf_log_impl(4,0x17c54c);
  }
  else {
    rf_log_impl(2,0x17c511,(char *)(ulong)uVar7);
  }
  paVar4 = &rf__ctx->field_0;
  __src = &prStack_10038;
  rf_load_default_shader();
  memcpy(&paVar4->default_shader,__src,0x84);
  prVar5 = rf__ctx;
  memcpy(&(rf__ctx->field_0).current_shader,&(rf__ctx->field_0).default_shader,0x84);
  (prVar5->field_0).transform.m0 = 1.0;
  (prVar5->field_0).transform.m4 = 0.0;
  (prVar5->field_0).transform.m8 = 0.0;
  (prVar5->field_0).transform.m12 = 0.0;
  (prVar5->field_0).transform.m1 = 0.0;
  (prVar5->field_0).transform.m5 = 1.0;
  (prVar5->field_0).transform.m9 = 0.0;
  (prVar5->field_0).transform.m13 = 0.0;
  (prVar5->field_0).transform.m2 = 0.0;
  (prVar5->field_0).transform.m6 = 0.0;
  (prVar5->field_0).transform.m10 = 1.0;
  (prVar5->field_0).transform.m14 = 0.0;
  (prVar5->field_0).transform.m3 = 0.0;
  (prVar5->field_0).transform.m7 = 0.0;
  (prVar5->field_0).transform.m11 = 0.0;
  (prVar5->field_0).transform.m15 = 1.0;
  lVar13 = 0;
  do {
    *(undefined4 *)((long)&(prVar5->field_0).stack[0].m0 + lVar13) = 0x3f800000;
    puVar1 = (undefined8 *)((long)&(prVar5->field_0).stack[0].m4 + lVar13);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)&(prVar5->field_0).stack[0].m5 + lVar13) = 0x3f800000;
    puVar1 = (undefined8 *)((long)&(prVar5->field_0).stack[0].m9 + lVar13);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)&(prVar5->field_0).stack[0].m10 + lVar13) = 0x3f800000;
    puVar1 = (undefined8 *)((long)&(prVar5->field_0).stack[0].m14 + lVar13);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)&(prVar5->field_0).stack[0].m15 + lVar13) = 0x3f800000;
    lVar13 = lVar13 + 0x40;
  } while (lVar13 != 0x800);
  (prVar5->field_0).projection.m4 = 0.0;
  (prVar5->field_0).projection.m8 = 0.0;
  (prVar5->field_0).projection.m12 = 0.0;
  (prVar5->field_0).projection.m1 = 0.0;
  (prVar5->field_0).projection.m5 = 1.0;
  (prVar5->field_0).projection.m9 = 0.0;
  (prVar5->field_0).projection.m13 = 0.0;
  (prVar5->field_0).projection.m2 = 0.0;
  (prVar5->field_0).projection.m6 = 0.0;
  (prVar5->field_0).projection.m10 = 1.0;
  (prVar5->field_0).projection.m14 = 0.0;
  (prVar5->field_0).projection.m3 = 0.0;
  (prVar5->field_0).projection.m7 = 0.0;
  (prVar5->field_0).projection.m11 = 0.0;
  (prVar5->field_0).projection.m15 = 1.0;
  (prVar5->field_0).modelview.m0 = 1.0;
  (prVar5->field_0).modelview.m4 = 0.0;
  (prVar5->field_0).modelview.m8 = 0.0;
  (prVar5->field_0).modelview.m12 = 0.0;
  (prVar5->field_0).modelview.m1 = 0.0;
  (prVar5->field_0).modelview.m5 = 1.0;
  (prVar5->field_0).modelview.m9 = 0.0;
  (prVar5->field_0).modelview.m13 = 0.0;
  (prVar5->field_0).modelview.m2 = 0.0;
  (prVar5->field_0).modelview.m6 = 0.0;
  (prVar5->field_0).modelview.m10 = 1.0;
  (prVar5->field_0).modelview.m14 = 0.0;
  (prVar5->field_0).modelview.m3 = 0.0;
  (prVar5->field_0).modelview.m7 = 0.0;
  (prVar5->field_0).modelview.m11 = 0.0;
  *(undefined8 *)&(prVar5->field_0).modelview.m15 = 0x3f8000003f800000;
  (prVar5->field_0).current_matrix = &(prVar5->field_0).modelview;
  rf_set_viewport(screen_width,screen_height);
  prVar5 = rf__ctx;
  (rf__ctx->field_0).default_font.glyphs_count = 0xe0;
  memset(__src,0,0x10000);
  iVar11 = 0;
  uVar9 = 0;
  do {
    uVar7 = rf_init_gfx::default_font_data[iVar11];
    lVar13 = 0x1f;
    do {
      if ((uVar7 >> ((uint)lVar13 & 0x1f) & 1) != 0) {
        *(undefined4 *)((long)__src + lVar13 * 4) = 0xffffffff;
      }
      bVar14 = lVar13 != 0;
      lVar13 = lVar13 + -1;
    } while (bVar14);
    bVar14 = 0x1ff < iVar11;
    iVar11 = iVar11 + 1;
    if (bVar14) {
      iVar11 = 0;
    }
    __src = __src + 0x10;
    bVar14 = uVar9 < 0x3fe0;
    uVar9 = uVar9 + 0x20;
  } while (bVar14);
  rf_format_pixels(&prStack_10038,0x10000,RF_UNCOMPRESSED_R8G8B8A8,
                   &(prVar5->field_0).default_font_buffers,0x8000,RF_UNCOMPRESSED_GRAY_ALPHA);
  prVar5 = rf__ctx;
  prStack_10038 = &(rf__ctx->field_0).default_font_buffers;
  pcStack_10030 = (char *)0x8000000080;
  uStack_10028 = CONCAT35(uStack_10028._5_3_,0x100000002);
  uStack_10020 = 1;
  image.field_0._4_4_ = in_stack_fffffffffffefee4;
  image.field_0._0_4_ = in_stack_fffffffffffefee0;
  image.field_0._8_8_ = in_stack_fffffffffffefee8;
  image.field_0.image.format = in_stack_fffffffffffefef0;
  image.field_0._20_4_ = in_stack_fffffffffffefef4;
  image.mipmaps = in_stack_fffffffffffefef8;
  image._28_4_ = in_stack_fffffffffffefefc;
  rf_load_texture_from_image_with_mipmaps(image);
  (prVar5->field_0).default_font.texture.format = (undefined4)uStack_10130;
  (prVar5->field_0).default_font.texture.valid = (_Bool)uStack_10130._4_1_;
  *(undefined3 *)&(prVar5->field_0).default_font.texture.field_0x15 = uStack_10130._5_3_;
  *(char **)&(prVar5->field_0).default_font.texture = pcStack_10140;
  *(char **)&(prVar5->field_0).default_font.texture.height = pcStack_10138;
  prVar5 = rf__ctx;
  (rf__ctx->field_0).default_font.glyphs = (rf__ctx->field_0).default_font_buffers.chars;
  if (0 < (prVar5->field_0).default_font.glyphs_count) {
    lVar13 = 0;
    iVar12 = 1;
    lVar10 = 0;
    iVar11 = 0;
    do {
      prVar3 = (prVar5->field_0).default_font.glyphs;
      (&prVar3->codepoint)[lVar13 * 2] = (int)lVar10 + 0x20;
      *(float *)((long)&prVar3->field_0 + lVar13 * 8) = (float)iVar12;
      *(float *)((long)&((prVar5->field_0).default_font.glyphs)->field_0 + lVar13 * 8 + 4) =
           (float)(iVar11 * 0xb + 1);
      iVar2 = *(int *)((long)&DAT_0017a830 + lVar13);
      *(float *)((long)&((prVar5->field_0).default_font.glyphs)->field_0 + lVar13 * 8 + 8) =
           (float)iVar2;
      *(undefined4 *)((long)&((prVar5->field_0).default_font.glyphs)->field_0 + lVar13 * 8 + 0xc) =
           0x41200000;
      prVar3 = (prVar5->field_0).default_font.glyphs;
      iVar12 = (int)(*(float *)((long)&prVar3->field_0 + lVar13 * 8 + 8) + 1.0) + iVar12;
      if ((prVar5->field_0).default_font.texture.width <= iVar12) {
        iVar12 = iVar2 + 2;
        *(undefined4 *)((long)&prVar3->field_0 + lVar13 * 8) = 0x3f800000;
        iVar2 = iVar11 * 0xb;
        iVar11 = iVar11 + 1;
        *(float *)((long)&((prVar5->field_0).default_font.glyphs)->field_0 + lVar13 * 8 + 4) =
             (float)(iVar2 + 0xc);
      }
      prVar3 = (prVar5->field_0).default_font.glyphs;
      *(undefined8 *)(&prVar3->offset_x + lVar13 * 2) = 0;
      (&prVar3->advance_x)[lVar13 * 2] = 0;
      lVar10 = lVar10 + 1;
      lVar13 = lVar13 + 4;
    } while (lVar10 < (prVar5->field_0).default_font.glyphs_count);
  }
  (prVar5->field_0).default_font.base_size =
       (int)(((prVar5->field_0).default_font.glyphs)->field_0).rec.height;
  (prVar5->field_0).default_font.valid = true;
  pcStack_10128 =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rf_log_impl(2,0x17c573,(char *)(ulong)(prVar5->field_0).default_font.texture.id);
  return;
}

Assistant:

RF_API void rf_init_gfx(int screen_width, int screen_height, rf_gfx_backend_data* gfx_data)
{
    rf_ctx.current_matrix_mode = -1;
    rf_ctx.screen_scaling = rf_mat_identity();

    rf_ctx.framebuffer_width  = screen_width;
    rf_ctx.framebuffer_height = screen_height;
    rf_ctx.render_width       = screen_width;
    rf_ctx.render_height      = screen_height;
    rf_ctx.current_width      = screen_width;
    rf_ctx.current_height     = screen_height;

    rf_gfx_backend_internal_init(gfx_data);

    // Initialize default shaders and default textures
    {
        // Init default white texture
        unsigned char pixels[4] = { 255, 255, 255, 255 }; // 1 pixel RGBA (4 bytes)
        rf_ctx.default_texture_id = rf_gfx_load_texture(pixels, 1, 1, RF_UNCOMPRESSED_R8G8B8A8, 1);

        if (rf_ctx.default_texture_id != 0)
        {
            RF_LOG(RF_LOG_TYPE_INFO, "Base white texture loaded successfully. [ Texture ID: %d ]", rf_ctx.default_texture_id);
        }
        else
        {
            RF_LOG(RF_LOG_TYPE_WARNING, "Base white texture could not be loaded");
        }

        // Init default shader (customized for GL 3.3 and ES2)
        rf_ctx.default_shader = rf_load_default_shader();
        rf_ctx.current_shader = rf_ctx.default_shader;

        // Init transformations matrix accumulator
        rf_ctx.transform = rf_mat_identity();

        // Init internal matrix stack (emulating OpenGL 1)
        for (rf_int i = 0; i < RF_MAX_MATRIX_STACK_SIZE; i++)
        {
            rf_ctx.stack[i] = rf_mat_identity();
        }

        // Init internal matrices
        rf_ctx.projection     = rf_mat_identity();
        rf_ctx.modelview      = rf_mat_identity();
        rf_ctx.current_matrix = &rf_ctx.modelview;
    }

    // Setup default viewport
    rf_set_viewport(screen_width, screen_height);

    // Load default font
    #if !defined(RF_NO_DEFAULT_FONT)
    {
        // NOTE: Using UTF8 encoding table for Unicode U+0000..U+00FF Basic Latin + Latin-1 Supplement
        // http://www.utf8-chartable.de/unicode-utf8-table.pl

        rf_ctx.default_font.glyphs_count = 224; // Number of chars included in our default font

        // Default font is directly defined here (data generated from a sprite font image)
        // This way, we reconstruct rf_font without creating large global variables
        // This data is automatically allocated to Stack and automatically deallocated at the end of this function
        static unsigned int default_font_data[512] = {
            0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00200020, 0x0001b000, 0x00000000, 0x00000000, 0x8ef92520, 0x00020a00, 0x7dbe8000, 0x1f7df45f,
            0x4a2bf2a0, 0x0852091e, 0x41224000, 0x10041450, 0x2e292020, 0x08220812, 0x41222000, 0x10041450, 0x10f92020, 0x3efa084c, 0x7d22103c, 0x107df7de,
            0xe8a12020, 0x08220832, 0x05220800, 0x10450410, 0xa4a3f000, 0x08520832, 0x05220400, 0x10450410, 0xe2f92020, 0x0002085e, 0x7d3e0281, 0x107df41f,
            0x00200000, 0x8001b000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
            0x00000000, 0x00000000, 0x00000000, 0x00000000, 0xc0000fbe, 0xfbf7e00f, 0x5fbf7e7d, 0x0050bee8, 0x440808a2, 0x0a142fe8, 0x50810285, 0x0050a048,
            0x49e428a2, 0x0a142828, 0x40810284, 0x0048a048, 0x10020fbe, 0x09f7ebaf, 0xd89f3e84, 0x0047a04f, 0x09e48822, 0x0a142aa1, 0x50810284, 0x0048a048,
            0x04082822, 0x0a142fa0, 0x50810285, 0x0050a248, 0x00008fbe, 0xfbf42021, 0x5f817e7d, 0x07d09ce8, 0x00008000, 0x00000fe0, 0x00000000, 0x00000000,
            0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x000c0180,
            0xdfbf4282, 0x0bfbf7ef, 0x42850505, 0x004804bf, 0x50a142c6, 0x08401428, 0x42852505, 0x00a808a0, 0x50a146aa, 0x08401428, 0x42852505, 0x00081090,
            0x5fa14a92, 0x0843f7e8, 0x7e792505, 0x00082088, 0x40a15282, 0x08420128, 0x40852489, 0x00084084, 0x40a16282, 0x0842022a, 0x40852451, 0x00088082,
            0xc0bf4282, 0xf843f42f, 0x7e85fc21, 0x3e0900bf, 0x00000000, 0x00000004, 0x00000000, 0x000c0180, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
            0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x04000402, 0x41482000, 0x00000000, 0x00000800,
            0x04000404, 0x4100203c, 0x00000000, 0x00000800, 0xf7df7df0, 0x514bef85, 0xbefbefbe, 0x04513bef, 0x14414500, 0x494a2885, 0xa28a28aa, 0x04510820,
            0xf44145f0, 0x474a289d, 0xa28a28aa, 0x04510be0, 0x14414510, 0x494a2884, 0xa28a28aa, 0x02910a00, 0xf7df7df0, 0xd14a2f85, 0xbefbe8aa, 0x011f7be0,
            0x00000000, 0x00400804, 0x20080000, 0x00000000, 0x00000000, 0x00600f84, 0x20080000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
            0xac000000, 0x00000f01, 0x00000000, 0x00000000, 0x24000000, 0x00000f01, 0x00000000, 0x06000000, 0x24000000, 0x00000f01, 0x00000000, 0x09108000,
            0x24fa28a2, 0x00000f01, 0x00000000, 0x013e0000, 0x2242252a, 0x00000f52, 0x00000000, 0x038a8000, 0x2422222a, 0x00000f29, 0x00000000, 0x010a8000,
            0x2412252a, 0x00000f01, 0x00000000, 0x010a8000, 0x24fbe8be, 0x00000f01, 0x00000000, 0x0ebe8000, 0xac020000, 0x00000f01, 0x00000000, 0x00048000,
            0x0003e000, 0x00000f00, 0x00000000, 0x00008000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000038, 0x8443b80e, 0x00203a03,
            0x02bea080, 0xf0000020, 0xc452208a, 0x04202b02, 0xf8029122, 0x07f0003b, 0xe44b388e, 0x02203a02, 0x081e8a1c, 0x0411e92a, 0xf4420be0, 0x01248202,
            0xe8140414, 0x05d104ba, 0xe7c3b880, 0x00893a0a, 0x283c0e1c, 0x04500902, 0xc4400080, 0x00448002, 0xe8208422, 0x04500002, 0x80400000, 0x05200002,
            0x083e8e00, 0x04100002, 0x804003e0, 0x07000042, 0xf8008400, 0x07f00003, 0x80400000, 0x04000022, 0x00000000, 0x00000000, 0x80400000, 0x04000002,
            0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00800702, 0x1848a0c2, 0x84010000, 0x02920921, 0x01042642, 0x00005121, 0x42023f7f, 0x00291002,
            0xefc01422, 0x7efdfbf7, 0xefdfa109, 0x03bbbbf7, 0x28440f12, 0x42850a14, 0x20408109, 0x01111010, 0x28440408, 0x42850a14, 0x2040817f, 0x01111010,
            0xefc78204, 0x7efdfbf7, 0xe7cf8109, 0x011111f3, 0x2850a932, 0x42850a14, 0x2040a109, 0x01111010, 0x2850b840, 0x42850a14, 0xefdfbf79, 0x03bbbbf7,
            0x001fa020, 0x00000000, 0x00001000, 0x00000000, 0x00002070, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
            0x08022800, 0x00012283, 0x02430802, 0x01010001, 0x8404147c, 0x20000144, 0x80048404, 0x00823f08, 0xdfbf4284, 0x7e03f7ef, 0x142850a1, 0x0000210a,
            0x50a14684, 0x528a1428, 0x142850a1, 0x03efa17a, 0x50a14a9e, 0x52521428, 0x142850a1, 0x02081f4a, 0x50a15284, 0x4a221428, 0xf42850a1, 0x03efa14b,
            0x50a16284, 0x4a521428, 0x042850a1, 0x0228a17a, 0xdfbf427c, 0x7e8bf7ef, 0xf7efdfbf, 0x03efbd0b, 0x00000000, 0x04000000, 0x00000000, 0x00000008,
            0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00200508, 0x00840400, 0x11458122, 0x00014210,
            0x00514294, 0x51420800, 0x20a22a94, 0x0050a508, 0x00200000, 0x00000000, 0x00050000, 0x08000000, 0xfefbefbe, 0xfbefbefb, 0xfbeb9114, 0x00fbefbe,
            0x20820820, 0x8a28a20a, 0x8a289114, 0x3e8a28a2, 0xfefbefbe, 0xfbefbe0b, 0x8a289114, 0x008a28a2, 0x228a28a2, 0x08208208, 0x8a289114, 0x088a28a2,
            0xfefbefbe, 0xfbefbefb, 0xfa2f9114, 0x00fbefbe, 0x00000000, 0x00000040, 0x00000000, 0x00000000, 0x00000000, 0x00000020, 0x00000000, 0x00000000,
            0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00210100, 0x00000004, 0x00000000, 0x00000000, 0x14508200, 0x00001402, 0x00000000, 0x00000000,
            0x00000010, 0x00000020, 0x00000000, 0x00000000, 0xa28a28be, 0x00002228, 0x00000000, 0x00000000, 0xa28a28aa, 0x000022e8, 0x00000000, 0x00000000,
            0xa28a28aa, 0x000022a8, 0x00000000, 0x00000000, 0xa28a28aa, 0x000022e8, 0x00000000, 0x00000000, 0xbefbefbe, 0x00003e2f, 0x00000000, 0x00000000,
            0x00000004, 0x00002028, 0x00000000, 0x00000000, 0x80000000, 0x00003e0f, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
            0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
            0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
            0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
            0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
            0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
            0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000
        };

        int chars_height  = 10;
        int chars_divisor = 1; // Every char is separated from the consecutive by a 1 pixel divisor, horizontally and vertically

        int chars_width[224] = {
            3, 1, 4, 6, 5, 7, 6, 2, 3, 3, 5, 5, 2, 4, 1, 7, 5, 2, 5, 5, 5, 5, 5, 5, 5, 5, 1, 1, 3, 4, 3, 6,
            7, 6, 6, 6, 6, 6, 6, 6, 6, 3, 5, 6, 5, 7, 6, 6, 6, 6, 6, 6, 7, 6, 7, 7, 6, 6, 6, 2, 7, 2, 3, 5,
            2, 5, 5, 5, 5, 5, 4, 5, 5, 1, 2, 5, 2, 5, 5, 5, 5, 5, 5, 5, 4, 5, 5, 5, 5, 5, 5, 3, 1, 3, 4, 4,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 5, 5, 5, 7, 1, 5, 3, 7, 3, 5, 4, 1, 7, 4, 3, 5, 3, 3, 2, 5, 6, 1, 2, 2, 3, 5, 6, 6, 6, 6,
            6, 6, 6, 6, 6, 6, 7, 6, 6, 6, 6, 6, 3, 3, 3, 3, 7, 6, 6, 6, 6, 6, 6, 5, 6, 6, 6, 6, 6, 6, 4, 6,
            5, 5, 5, 5, 5, 5, 9, 5, 5, 5, 5, 5, 2, 2, 3, 3, 5, 5, 5, 5, 5, 5, 5, 5, 5, 5, 5, 5, 5, 5, 3, 5
        };

        // Re-construct image from rf_ctx->default_font_data and generate a texture
        //----------------------------------------------------------------------
        {
            rf_color font_pixels[128 * 128] = {0};

            int counter = 0; // rf_font data elements counter

            // Fill with default_font_data (convert from bit to pixel!)
            for (rf_int i = 0; i < 128 * 128; i += 32)
            {
                for (rf_int j = 31; j >= 0; j--)
                {
                    const int bit_check = (default_font_data[counter]) & (1u << j);
                    if (bit_check) font_pixels[i + j] = RF_WHITE;
                }

                counter++;

                if (counter > 512) counter = 0; // Security check...
            }

            bool format_success = rf_format_pixels(font_pixels, 128 * 128 * sizeof(rf_color), RF_UNCOMPRESSED_R8G8B8A8,
                                                   rf_ctx.default_font_buffers.pixels, 128 * 128 * 2, RF_UNCOMPRESSED_GRAY_ALPHA);

            RF_ASSERT(format_success);
        }

        rf_image font_image = {
            .data = rf_ctx.default_font_buffers.pixels,
            .format = RF_UNCOMPRESSED_GRAY_ALPHA,
            .width = 128,
            .height = 128,
            .valid = true,
        };

        rf_ctx.default_font.texture = rf_load_texture_from_image(font_image);

        // Allocate space for our characters info data
        rf_ctx.default_font.glyphs = rf_ctx.default_font_buffers.chars;

        int current_line     = 0;
        int current_pos_x    = chars_divisor;
        int test_pos_x       = chars_divisor;
        int char_pixels_iter = 0;

        for (rf_int i = 0; i < rf_ctx.default_font.glyphs_count; i++)
        {
            rf_ctx.default_font.glyphs[i].codepoint = 32 + i; // First char is 32

            rf_ctx.default_font.glyphs[i].x      = (float) current_pos_x;
            rf_ctx.default_font.glyphs[i].y      = (float) (chars_divisor + current_line * (chars_height + chars_divisor));
            rf_ctx.default_font.glyphs[i].width  = (float) chars_width[i];
            rf_ctx.default_font.glyphs[i].height = (float) chars_height;

            test_pos_x += (int) (rf_ctx.default_font.glyphs[i].width + (float)chars_divisor);

            if (test_pos_x >= rf_ctx.default_font.texture.width)
            {
                current_line++;
                current_pos_x = 2 * chars_divisor + chars_width[i];
                test_pos_x = current_pos_x;

                rf_ctx.default_font.glyphs[i].x = (float) (chars_divisor);
                rf_ctx.default_font.glyphs[i].y = (float) (chars_divisor + current_line * (chars_height + chars_divisor));
            }
            else current_pos_x = test_pos_x;

            // NOTE: On default font character offsets and xAdvance are not required
            rf_ctx.default_font.glyphs[i].offset_x = 0;
            rf_ctx.default_font.glyphs[i].offset_y = 0;
            rf_ctx.default_font.glyphs[i].advance_x = 0;
        }

        rf_ctx.default_font.base_size = (int)rf_ctx.default_font.glyphs[0].height;
        rf_ctx.default_font.valid = true;

        RF_LOG(RF_LOG_TYPE_INFO, "[TEX ID %i] Default font loaded successfully", rf_ctx.default_font.texture.id);
    }
    #endif
}